

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

BranchLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_branch(NeuralNetworkLayer *this)

{
  bool bVar1;
  BranchLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_branch(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_branch(this);
    this_00 = (BranchLayerParams *)operator_new(0x28);
    BranchLayerParams::BranchLayerParams(this_00);
    (this->layer_).branch_ = this_00;
  }
  return (BranchLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::BranchLayerParams* NeuralNetworkLayer::mutable_branch() {
  if (!has_branch()) {
    clear_layer();
    set_has_branch();
    layer_.branch_ = new ::CoreML::Specification::BranchLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.branch)
  return layer_.branch_;
}